

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void __thiscall Container::dup2_fds(Container *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_38;
  
  iVar1 = (((this->task_data_).ptr_)->stdin_desc).fd;
  if (iVar1 != -1) {
    iVar1 = dup2(iVar1,0);
    if (iVar1 != 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot dup2 stdin: %m");
      (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  iVar1 = (((this->task_data_).ptr_)->stdout_desc).fd;
  if (iVar1 != -1) {
    iVar1 = dup2(iVar1,1);
    if (iVar1 != 1) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot dup2 stdout: %m");
      (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  iVar1 = (((this->task_data_).ptr_)->stderr_desc).fd;
  if (iVar1 != -1) {
    iVar1 = dup2(iVar1,2);
    if (iVar1 != 2) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_38,"Cannot dup2 stderr: %m");
      (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void Container::dup2_fds() {
    if (task_data_->stdin_desc.fd != -1) {
        if (dup2(task_data_->stdin_desc.fd, STDIN_FILENO) != STDIN_FILENO) {
            die(format("Cannot dup2 stdin: %m"));
        }
    }

    if (task_data_->stdout_desc.fd != -1) {
        if (dup2(task_data_->stdout_desc.fd, STDOUT_FILENO) != STDOUT_FILENO) {
            die(format("Cannot dup2 stdout: %m"));
        }
    }

    if (task_data_->stderr_desc.fd != -1) {
        if (dup2(task_data_->stderr_desc.fd, STDERR_FILENO) != STDERR_FILENO) {
            die(format("Cannot dup2 stderr: %m"));
        }
    }
}